

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall rengine::OpenGLRenderer::prepass(OpenGLRenderer *this,Node *n)

{
  uint uVar1;
  Node *n_00;
  TextureNode *tn;
  float fVar2;
  
  uVar1 = *(uint *)&n->field_0x30;
  if ((uVar1 >> 8 & 1) != 0) {
    *(uint *)&n->field_0x30 = uVar1 & 0xfffffeff;
    (*(n->super_SignalEmitter)._vptr_SignalEmitter[4])(n);
    uVar1 = *(uint *)&n->field_0x30;
  }
  uVar1 = uVar1 & 0xff;
  if (0x40 < uVar1) {
    if (uVar1 == 0x41) {
      fVar2 = *(float *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
              *(float *)&n->field_0x34;
      if ((((fVar2 != 0.0) || (NAN(fVar2))) &&
          ((fVar2 = *(float *)&n[1].super_SignalEmitter.m_buckets -
                    *(float *)&n[1].super_SignalEmitter._vptr_SignalEmitter, fVar2 != 0.0 ||
           (NAN(fVar2))))) && (0.001 <= *(float *)&n[1].m_child)) {
        this->m_numRectangleNodes = this->m_numRectangleNodes + 1;
      }
    }
    else if (uVar1 == 0x43) {
      this->m_numRenderNodes = this->m_numRenderNodes + 1;
    }
    else if ((((uVar1 == 0x42) &&
              ((fVar2 = *(float *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
                        *(float *)&n->field_0x34, fVar2 != 0.0 || (NAN(fVar2))))) &&
             ((fVar2 = *(float *)&n[1].super_SignalEmitter.m_buckets -
                       *(float *)&n[1].super_SignalEmitter._vptr_SignalEmitter, fVar2 != 0.0 ||
              (NAN(fVar2))))) && (n[1].m_parent != (Node *)0x0)) {
      this->m_numTextureNodes = this->m_numTextureNodes + 1;
    }
    goto switchD_00124331_default;
  }
  switch(uVar1) {
  case 1:
    this->m_numTransformNodes = this->m_numTransformNodes + 1;
    if (0.0 < *(float *)&n[2].super_SignalEmitter.m_buckets) {
      this->m_numTransformNodesWith3d = this->m_numTransformNodesWith3d + 1;
    }
    break;
  case 2:
    if (1.0 < *(float *)&n->field_0x34 || *(float *)&n->field_0x34 == 1.0) break;
    goto LAB_00124453;
  case 3:
    if (*(int *)((long)&n[2].super_SignalEmitter._vptr_SignalEmitter + 4) == 0) break;
LAB_00124453:
    this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
    break;
  case 4:
    if (*(int *)&n->field_0x34 != 0) {
      this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
      this->m_additionalQuads = this->m_additionalQuads + 2;
    }
    break;
  case 5:
    if (0.0 < *(float *)((long)&n[1].m_parent + 4)) {
      this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
      this->m_additionalQuads = this->m_additionalQuads + 3;
    }
  }
switchD_00124331_default:
  for (n_00 = n->m_child; n_00 != (Node *)0x0; n_00 = Node::sibling(n_00)) {
    prepass(this,n_00);
  }
  return;
}

Assistant:

inline void OpenGLRenderer::prepass(Node *n)
{
    n->preprocess();
    switch (n->type()) {
    case Node::TextureNodeType: {
        TextureNode *tn = static_cast<TextureNode *>(n);
        if (tn->width() != 0.0f && tn->height() != 0.0f && tn->texture() != nullptr)
            ++m_numTextureNodes;
    }   break;
    case Node::RectangleNodeType: {
        RectangleNode *rn = static_cast<RectangleNode *>(n);
        if (rn->width() != 0.0f && rn->height() != 0.0f && !(rn->color().w < RENGINE_RENDERER_ALPHA_THRESHOLD))
            ++m_numRectangleNodes;
    }   break;
    case Node::TransformNodeType:
        ++m_numTransformNodes;
        if (static_cast<TransformNode *>(n)->projectionDepth() > 0)
            ++m_numTransformNodesWith3d;
        break;
    // All layered nodes take this path..
    case Node::ColorFilterNodeType:
        if (!static_cast<ColorFilterNode *>(n)->colorMatrix().isIdentity())
            ++m_numLayeredNodes;
        break;
    case Node::OpacityNodeType:
        if (static_cast<OpacityNode *>(n)->opacity() < 1)
            ++m_numLayeredNodes;
        break;
    case Node::BlurNodeType:
        if (static_cast<BlurNode *>(n)->radius() > 0) {
            ++m_numLayeredNodes;
            m_additionalQuads += 2;
        }
        break;
    case Node::ShadowNodeType:
        if (static_cast<ShadowNode *>(n)->color().w > 0) {
            ++m_numLayeredNodes;
            m_additionalQuads += 3;
        }
        break;
    case Node::RenderNodeType:
        ++m_numRenderNodes;
        break;

    default:
        // ignore...
        break;
    }

    for (Node *c = n->child(); c; c = c->sibling())
        prepass(c);
}